

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlTextConcat(xmlNodePtr node,xmlChar *content,int len)

{
  int iVar1;
  xmlChar *pxVar2;
  int len_local;
  xmlChar *content_local;
  xmlNodePtr node_local;
  
  if (node == (xmlNodePtr)0x0) {
    return -1;
  }
  if ((((node->type != XML_TEXT_NODE) && (node->type != XML_CDATA_SECTION_NODE)) &&
      (node->type != XML_COMMENT_NODE)) && (node->type != XML_PI_NODE)) {
    return -1;
  }
  if (((_xmlAttr **)node->content == &node->properties) ||
     (((node->doc != (_xmlDoc *)0x0 && (node->doc->dict != (_xmlDict *)0x0)) &&
      (iVar1 = xmlDictOwns(node->doc->dict,node->content), iVar1 != 0)))) {
    pxVar2 = xmlStrncatNew(node->content,content,len);
    node->content = pxVar2;
  }
  else {
    pxVar2 = xmlStrncat(node->content,content,len);
    node->content = pxVar2;
  }
  node->properties = (_xmlAttr *)0x0;
  if (node->content == (xmlChar *)0x0) {
    node_local._4_4_ = -1;
  }
  else {
    node_local._4_4_ = 0;
  }
  return node_local._4_4_;
}

Assistant:

int
xmlTextConcat(xmlNodePtr node, const xmlChar *content, int len) {
    if (node == NULL) return(-1);

    if ((node->type != XML_TEXT_NODE) &&
        (node->type != XML_CDATA_SECTION_NODE) &&
	(node->type != XML_COMMENT_NODE) &&
	(node->type != XML_PI_NODE)) {
#ifdef DEBUG_TREE
	xmlGenericError(xmlGenericErrorContext,
		"xmlTextConcat: node is not text nor CDATA\n");
#endif
        return(-1);
    }
    /* need to check if content is currently in the dictionary */
    if ((node->content == (xmlChar *) &(node->properties)) ||
        ((node->doc != NULL) && (node->doc->dict != NULL) &&
		xmlDictOwns(node->doc->dict, node->content))) {
	node->content = xmlStrncatNew(node->content, content, len);
    } else {
        node->content = xmlStrncat(node->content, content, len);
    }
    node->properties = NULL;
    if (node->content == NULL)
        return(-1);
    return(0);
}